

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * QByteArray::toUpper_helper(QByteArray *a)

{
  QByteArray *in_RDI;
  _func_uchar_uchar *in_stack_00000050;
  QByteArray *in_stack_00000058;
  
  toCase_template<QByteArray>(in_stack_00000058,in_stack_00000050);
  return in_RDI;
}

Assistant:

QByteArray QByteArray::toUpper_helper(QByteArray &a)
{
    return toCase_template(a, asciiUpper);
}